

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_CreateDevice
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_CREATE *deviceCreateInfo,IOTHUB_DEVICE *deviceInfo)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_DEVICE_OR_MODULE IStack_108;
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE local_68;
  
  if ((deviceCreateInfo == (IOTHUB_REGISTRY_DEVICE_CREATE *)0x0 ||
      registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      deviceInfo == (IOTHUB_DEVICE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_CreateDevice",0x5c5,1,"Input parameter cannot be NULL");
    }
  }
  else {
    memset(&IStack_108,0,0xa0);
    local_68.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
    local_68._4_4_ = 0;
    local_68.moduleId = (char *)0x0;
    local_68.managedBy = (char *)0x0;
    local_68.deviceId = deviceCreateInfo->deviceId;
    local_68.primaryKey = deviceCreateInfo->primaryKey;
    local_68.secondaryKey = deviceCreateInfo->secondaryKey;
    local_68._36_4_ = 0;
    local_68.authMethod = deviceCreateInfo->authMethod;
    IVar1 = IoTHubRegistryManager_CreateDeviceOrModule(registryManagerHandle,&local_68,&IStack_108);
    if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
      deviceInfo->deviceId = IStack_108.deviceId;
      deviceInfo->primaryKey = IStack_108.primaryKey;
      deviceInfo->secondaryKey = IStack_108.secondaryKey;
      deviceInfo->generationId = IStack_108.generationId;
      deviceInfo->eTag = IStack_108.eTag;
      deviceInfo->connectionState = IStack_108.connectionState;
      deviceInfo->connectionStateUpdatedTime = IStack_108.connectionStateUpdatedTime;
      deviceInfo->status = IStack_108.status;
      deviceInfo->statusReason = IStack_108.statusReason;
      deviceInfo->statusUpdatedTime = IStack_108.statusUpdatedTime;
      deviceInfo->lastActivityTime = IStack_108.lastActivityTime;
      deviceInfo->cloudToDeviceMessageCount = IStack_108.cloudToDeviceMessageCount;
      deviceInfo->isManaged = IStack_108.isManaged;
      deviceInfo->configuration = IStack_108.configuration;
      deviceInfo->deviceProperties = IStack_108.deviceProperties;
      deviceInfo->serviceProperties = IStack_108.serviceProperties;
      deviceInfo->authMethod = IStack_108.authMethod;
      free(IStack_108.moduleId);
      IStack_108.moduleId = (char *)0x0;
      free(IStack_108.managedBy);
    }
  }
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_CreateDevice(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const IOTHUB_REGISTRY_DEVICE_CREATE* deviceCreateInfo, IOTHUB_DEVICE* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceCreateInfo == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE deviceOrModuleCreateInfo;
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;

        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));
        memset(&deviceOrModuleCreateInfo, 0, sizeof(deviceOrModuleCreateInfo));
        deviceOrModuleCreateInfo.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
        deviceOrModuleCreateInfo.deviceId = deviceCreateInfo->deviceId;
        deviceOrModuleCreateInfo.primaryKey = deviceCreateInfo->primaryKey;
        deviceOrModuleCreateInfo.secondaryKey = deviceCreateInfo->secondaryKey;
        deviceOrModuleCreateInfo.authMethod = deviceCreateInfo->authMethod;
        deviceOrModuleCreateInfo.iotEdge_capable = false; //IOTHUB_DEVICE does not have this field, so set it to disabled

        result = IoTHubRegistryManager_CreateDeviceOrModule(registryManagerHandle, &deviceOrModuleCreateInfo, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_device(&deviceOrModuleInfo, deviceInfo);
            free_nonDevice_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}